

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int EmitRescaledAlphaYUV(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  int iVar1;
  int iVar2;
  WebPDecBuffer *pWVar3;
  uint8_t *puVar4;
  int num_rows;
  uint8_t *alpha;
  long lVar5;
  
  pWVar3 = p->output;
  puVar4 = (pWVar3->u).YUVA.a;
  iVar1 = p->last_y;
  lVar5 = (long)(pWVar3->u).YUVA.a_stride;
  alpha = puVar4 + lVar5 * iVar1;
  if (io->a == (uint8_t *)0x0) {
    if (0 < expected_num_lines_out && puVar4 != (uint8_t *)0x0) {
      iVar1 = io->scaled_width;
      do {
        memset(alpha,0xff,(long)iVar1);
        alpha = alpha + lVar5;
        expected_num_lines_out = expected_num_lines_out + -1;
      } while (expected_num_lines_out != 0);
    }
  }
  else {
    puVar4 = (pWVar3->u).RGBA.rgba;
    iVar2 = (pWVar3->u).YUVA.y_stride;
    num_rows = Rescale(io->a,io->width,io->mb_h,p->scaler_a);
    if (0 < num_rows) {
      WebPMultRows(puVar4 + (long)iVar2 * (long)iVar1,(pWVar3->u).YUVA.y_stride,alpha,
                   (pWVar3->u).YUVA.a_stride,p->scaler_a->dst_width,num_rows,1);
    }
  }
  return 0;
}

Assistant:

static int EmitRescaledAlphaYUV(const VP8Io* const io, WebPDecParams* const p,
                                int expected_num_lines_out) {
  const WebPYUVABuffer* const buf = &p->output->u.YUVA;
  uint8_t* const dst_a = buf->a + (size_t)p->last_y * buf->a_stride;
  if (io->a != NULL) {
    uint8_t* const dst_y = buf->y + (size_t)p->last_y * buf->y_stride;
    const int num_lines_out = Rescale(io->a, io->width, io->mb_h, p->scaler_a);
    assert(expected_num_lines_out == num_lines_out);
    if (num_lines_out > 0) {   // unmultiply the Y
      WebPMultRows(dst_y, buf->y_stride, dst_a, buf->a_stride,
                   p->scaler_a->dst_width, num_lines_out, 1);
    }
  } else if (buf->a != NULL) {
    // the user requested alpha, but there is none, set it to opaque.
    assert(p->last_y + expected_num_lines_out <= io->scaled_height);
    FillAlphaPlane(dst_a, io->scaled_width, expected_num_lines_out,
                   buf->a_stride);
  }
  return 0;
}